

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O2

void pinger_on_connect(uv_connect_t *req,int status)

{
  pinger_t *pinger;
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  pinger = (pinger_t *)req->handle->data;
  pinger_on_connect_count = pinger_on_connect_count + 1;
  if (status == 0) {
    iVar1 = uv_is_readable(req->handle);
    if (iVar1 == 1) {
      iVar1 = uv_is_writable(req->handle);
      if (iVar1 == 1) {
        iVar1 = uv_is_closing((uv_handle_t *)req->handle);
        if (iVar1 == 0) {
          pinger_write_ping(pinger);
          uv_read_start(req->handle,alloc_cb,pinger_read_cb);
          return;
        }
        pcVar3 = "0 == uv_is_closing((uv_handle_t *) req->handle)";
        uVar2 = 0xa0;
      }
      else {
        pcVar3 = "1 == uv_is_writable(req->handle)";
        uVar2 = 0x9f;
      }
    }
    else {
      pcVar3 = "1 == uv_is_readable(req->handle)";
      uVar2 = 0x9e;
    }
  }
  else {
    pcVar3 = "status == 0";
    uVar2 = 0x9c;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ping-pong.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void pinger_on_connect(uv_connect_t *req, int status) {
  pinger_t *pinger = (pinger_t*)req->handle->data;

  pinger_on_connect_count++;

  ASSERT(status == 0);

  ASSERT(1 == uv_is_readable(req->handle));
  ASSERT(1 == uv_is_writable(req->handle));
  ASSERT(0 == uv_is_closing((uv_handle_t *) req->handle));

  pinger_write_ping(pinger);

  uv_read_start((uv_stream_t*)(req->handle), alloc_cb, pinger_read_cb);
}